

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbox_core.cpp
# Opt level: O0

void __thiscall so_5::impl::mbox_core_t::mbox_core_t(mbox_core_t *this,tracer_t *tracer)

{
  tracer_t *tracer_local;
  mbox_core_t *this_local;
  
  atomic_refcounted_t::atomic_refcounted_t(&this->super_atomic_refcounted_t);
  this->_vptr_mbox_core_t = (_func_int **)&PTR__mbox_core_t_005c1ae8;
  this->m_tracer = tracer;
  std::mutex::mutex(&this->m_dictionary_lock);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::impl::mbox_core_t::named_mbox_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::impl::mbox_core_t::named_mbox_info_t>_>_>
  ::map(&this->m_named_mboxes_dictionary);
  std::atomic<unsigned_long_long>::atomic(&this->m_mbox_id_counter,1);
  return;
}

Assistant:

mbox_core_t::mbox_core_t(
	so_5::msg_tracing::tracer_t * tracer )
	:	m_tracer{ tracer }
	,	m_mbox_id_counter{ 1 }
{
}